

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.cpp
# Opt level: O0

void * NULLC::alignedAlloc(int size,int extraSize)

{
  long lVar1;
  void *ptr;
  void *unaligned;
  int extraSize_local;
  int size_local;
  
  lVar1 = (*(code *)alloc)(size + 0x17 + extraSize);
  if (lVar1 == 0) {
    _extraSize_local = (void *)0x0;
  }
  else {
    _extraSize_local = (void *)((lVar1 + extraSize + 0x17U & 0xfffffffffffffff0) - (long)extraSize);
    *(long *)((long)_extraSize_local + -8) = lVar1;
  }
  return _extraSize_local;
}

Assistant:

void* NULLC::alignedAlloc(int size, int extraSize)
{
	void *unaligned = alloc((size + 16 - 1) + sizeof(void*) + extraSize);
	if(!unaligned)
		return NULL;
	void *ptr = (void*)((((intptr_t)unaligned + sizeof(void*) + extraSize + 16 - 1) & ~(16 - 1)) - extraSize);
	memcpy((void**)ptr - 1, &unaligned, sizeof(unaligned));
	return ptr;
}